

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProduct.cpp
# Opt level: O0

MatrixXd * __thiscall
mnf::CartesianProduct::diffPseudoLog0_
          (MatrixXd *__return_storage_ptr__,CartesianProduct *this,ConstRefVec *x)

{
  ulong uVar1;
  size_type sVar2;
  __shared_ptr_access<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  RefMat local_128;
  Type local_100;
  ConstSegment local_c8;
  ConstRefVec local_90;
  MatrixXd local_68;
  ulong local_50;
  size_t i;
  Index local_38;
  Index local_30;
  undefined1 local_21;
  ConstRefVec *local_20;
  ConstRefVec *x_local;
  CartesianProduct *this_local;
  MatrixXd *J;
  
  local_21 = 0;
  local_20 = x;
  x_local = (ConstRefVec *)this;
  this_local = (CartesianProduct *)__return_storage_ptr__;
  local_30 = Manifold::tangentDim(&this->super_Manifold);
  local_38 = Manifold::representationDim(&this->super_Manifold);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<long,long>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,&local_30,&local_38);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__);
  for (local_50 = 0; uVar1 = local_50,
      sVar2 = std::
              vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
              ::size(&this->subManifolds_), uVar1 < sVar2; local_50 = local_50 + 1) {
    this_00 = (__shared_ptr_access<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::
              vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
              ::operator[](&this->subManifolds_,local_50);
    this_01 = std::
              __shared_ptr_access<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(this_00);
    Manifold::getConstView<0>(&local_c8,&this->super_Manifold,local_20,local_50);
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>const,_1,1,false>>
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_90,
               (DenseBase<Eigen::Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                *)&local_c8,(type *)0x0);
    Manifold::diffPseudoLog0(&local_68,this_01,&local_90);
    Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>::
    Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>> *)&local_128,
               &__return_storage_ptr__->
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,(type *)0x0);
    Manifold::getView<1,0>(&local_100,&this->super_Manifold,&local_128,local_50);
    Eigen::
    Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>,-1,-1,false>::
    operator=((Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,false>
               *)&local_100,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_68);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_68);
    Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
              (&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd CartesianProduct::diffPseudoLog0_(const ConstRefVec& x) const
{
  Eigen::MatrixXd J(tangentDim(), representationDim());
  J.setZero();
  for (size_t i = 0; i < subManifolds_.size(); ++i)
  {
    getView<T, R>(J, i) =
        subManifolds_[i]->diffPseudoLog0(getConstView<R>(x, i));
  }
  return J;
}